

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

char * __thiscall cmsys::RegExpCompile::regpiece(RegExpCompile *this,int *flagp)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  int flags;
  uint local_2c;
  
  pcVar2 = regatom(this,(int *)&local_2c);
  if (pcVar2 == (char *)0x0) {
    return (char *)0x0;
  }
  bVar1 = *this->regparse;
  if ((0x3f < (ulong)bVar1) || ((0x80000c0000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
    *flagp = local_2c;
    return pcVar2;
  }
  if (bVar1 != 0x3f && (local_2c & 1) == 0) {
    pcVar2 = "RegularExpression::compile() : *+ operand could be empty.";
    goto LAB_001298dc;
  }
  *flagp = (uint)(bVar1 != 0x2b) * 3 + 1;
  if (bVar1 == 0x2a) {
    pcVar4 = this->regcode;
    if ((local_2c & 2) == 0) {
      if (pcVar4 == &regdummy) {
        this->regsize = this->regsize + 3;
LAB_0012977d:
        this->regsize = this->regsize + 3;
        pcVar4 = &regdummy;
      }
      else {
        this->regcode = pcVar4 + 3;
        for (; pcVar2 < pcVar4; pcVar4 = pcVar4 + -1) {
          pcVar4[2] = pcVar4[-1];
        }
        pcVar2[0] = '\x06';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar4 = this->regcode;
        if (pcVar4 == &regdummy) goto LAB_0012977d;
        pcVar4[0] = '\a';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        this->regcode = pcVar4 + 3;
      }
      if ((pcVar2 != &regdummy) && (*pcVar2 == '\x06')) {
        regtail(pcVar2 + 3,pcVar4);
        if (*pcVar2 == '\x06') {
          regtail(pcVar2 + 3,pcVar2);
        }
      }
      pcVar5 = this->regcode;
      pcVar4 = pcVar2;
      if (pcVar5 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar5[0] = '\x06';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        this->regcode = pcVar5 + 3;
      }
LAB_0012988d:
      regtail(pcVar4,pcVar5);
      pcVar4 = this->regcode;
      pcVar5 = pcVar2;
      if (pcVar4 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar4[0] = '\t';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        this->regcode = pcVar4 + 3;
      }
      goto LAB_001298b6;
    }
    if (pcVar4 == &regdummy) {
LAB_0012976e:
      this->regsize = this->regsize + 3;
    }
    else {
      this->regcode = pcVar4 + 3;
      for (; pcVar2 < pcVar4; pcVar4 = pcVar4 + -1) {
        pcVar4[2] = pcVar4[-1];
      }
      pcVar2[0] = '\n';
      pcVar2[1] = '\0';
LAB_00129765:
      pcVar2[2] = '\0';
    }
  }
  else {
    if (bVar1 == 0x2b) {
      pcVar4 = this->regcode;
      if ((local_2c & 2) != 0) {
        if (pcVar4 == &regdummy) goto LAB_0012976e;
        this->regcode = pcVar4 + 3;
        for (; pcVar2 < pcVar4; pcVar4 = pcVar4 + -1) {
          pcVar4[2] = pcVar4[-1];
        }
        pcVar2[0] = '\v';
        pcVar2[1] = '\0';
        goto LAB_00129765;
      }
      if (pcVar4 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar4[0] = '\x06';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        this->regcode = pcVar4 + 3;
      }
      regtail(pcVar2,pcVar4);
      pcVar5 = this->regcode;
      if (pcVar5 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar5[0] = '\a';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        this->regcode = pcVar5 + 3;
      }
      regtail(pcVar5,pcVar2);
      pcVar5 = this->regcode;
      if (pcVar5 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar5[0] = '\x06';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        this->regcode = pcVar5 + 3;
      }
      goto LAB_0012988d;
    }
    if (bVar1 != 0x3f) goto LAB_001298bb;
    pcVar4 = this->regcode;
    if (pcVar4 == &regdummy) {
      this->regsize = this->regsize + 3;
LAB_00129808:
      this->regsize = this->regsize + 3;
      pcVar4 = &regdummy;
    }
    else {
      this->regcode = pcVar4 + 3;
      for (; pcVar2 < pcVar4; pcVar4 = pcVar4 + -1) {
        pcVar4[2] = pcVar4[-1];
      }
      pcVar2[0] = '\x06';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar4 = this->regcode;
      if (pcVar4 == &regdummy) goto LAB_00129808;
      pcVar4[0] = '\x06';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      this->regcode = pcVar4 + 3;
    }
    regtail(pcVar2,pcVar4);
    pcVar4 = this->regcode;
    if (pcVar4 == &regdummy) {
      this->regsize = this->regsize + 3;
    }
    else {
      pcVar4[0] = '\t';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      this->regcode = pcVar4 + 3;
    }
    regtail(pcVar2,pcVar4);
    if ((pcVar2 == &regdummy) || (*pcVar2 != '\x06')) goto LAB_001298bb;
    pcVar5 = pcVar2 + 3;
LAB_001298b6:
    regtail(pcVar5,pcVar4);
  }
LAB_001298bb:
  pcVar4 = this->regparse;
  this->regparse = pcVar4 + 1;
  uVar3 = (ulong)(byte)pcVar4[1];
  if (0x3f < uVar3) {
    return pcVar2;
  }
  if ((0x80000c0000000000U >> (uVar3 & 0x3f) & 1) == 0) {
    return pcVar2;
  }
  pcVar2 = "RegularExpression::compile(): Nested *?+.";
LAB_001298dc:
  puts(pcVar2);
  return (char *)0x0;
}

Assistant:

char* RegExpCompile::regpiece(int* flagp)
{
  char* ret;
  char op;
  char* next;
  int flags;

  ret = regatom(&flags);
  if (ret == nullptr)
    return (nullptr);

  op = *regparse;
  if (!ISMULT(op)) {
    *flagp = flags;
    return (ret);
  }

  if (!(flags & HASWIDTH) && op != '?') {
    // RAISE Error, SYM(RegularExpression), SYM(Empty_Operand),
    printf("RegularExpression::compile() : *+ operand could be empty.\n");
    return nullptr;
  }
  *flagp = (op != '+') ? (WORST | SPSTART) : (WORST | HASWIDTH);

  if (op == '*' && (flags & SIMPLE))
    reginsert(STAR, ret);
  else if (op == '*') {
    // Emit x* as (x&|), where & means "self".
    reginsert(BRANCH, ret);         // Either x
    regoptail(ret, regnode(BACK));  // and loop
    regoptail(ret, ret);            // back
    regtail(ret, regnode(BRANCH));  // or
    regtail(ret, regnode(NOTHING)); // null.
  } else if (op == '+' && (flags & SIMPLE))
    reginsert(PLUS, ret);
  else if (op == '+') {
    // Emit x+ as x(&|), where & means "self".
    next = regnode(BRANCH); // Either
    regtail(ret, next);
    regtail(regnode(BACK), ret);    // loop back
    regtail(next, regnode(BRANCH)); // or
    regtail(ret, regnode(NOTHING)); // null.
  } else if (op == '?') {
    // Emit x? as (x|)
    reginsert(BRANCH, ret);        // Either x
    regtail(ret, regnode(BRANCH)); // or
    next = regnode(NOTHING);       // null.
    regtail(ret, next);
    regoptail(ret, next);
  }
  regparse++;
  if (ISMULT(*regparse)) {
    // RAISE Error, SYM(RegularExpression), SYM(Nested_Operand),
    printf("RegularExpression::compile(): Nested *?+.\n");
    return nullptr;
  }
  return (ret);
}